

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void Assimp::OpenGEX::fillColor4(aiColor4D *col4,Value *vals)

{
  DeadlyImportError *pDVar1;
  float fVar2;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  Value *local_20;
  Value *next;
  Value *vals_local;
  aiColor4D *col4_local;
  
  next = vals;
  vals_local = (Value *)col4;
  if (col4 == (aiColor4D *)0x0) {
    __assert_fail("nullptr != col4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x311,"void Assimp::OpenGEX::fillColor4(aiColor4D *, Value *)");
  }
  if (vals == (Value *)0x0) {
    __assert_fail("nullptr != vals",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x312,"void Assimp::OpenGEX::fillColor4(aiColor4D *, Value *)");
  }
  local_20 = vals;
  fVar2 = ODDLParser::Value::getFloat(vals);
  vals_local->m_type = (ValueType)fVar2;
  local_20 = local_20->m_next;
  if (local_20 == (Value *)0x0) {
    local_55 = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"OpenGEX: Not enough values to fill 4-element color, only 1",
               &local_41);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_40);
    local_55 = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  fVar2 = ODDLParser::Value::getFloat(local_20);
  *(float *)&vals_local->field_0x4 = fVar2;
  local_20 = local_20->m_next;
  if (local_20 == (Value *)0x0) {
    local_7a = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"OpenGEX: Not enough values to fill 4-element color, only 2",
               &local_79);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_78);
    local_7a = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  fVar2 = ODDLParser::Value::getFloat(local_20);
  *(float *)&vals_local->m_size = fVar2;
  local_20 = local_20->m_next;
  if (local_20 == (Value *)0x0) {
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"OpenGEX: Not enough values to fill 4-element color, only 3",
               &local_a1);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_a0);
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  fVar2 = ODDLParser::Value::getFloat(local_20);
  *(float *)((long)&vals_local->m_size + 4) = fVar2;
  return;
}

Assistant:

static void fillColor4( aiColor4D *col4, Value *vals ) {
    ai_assert( nullptr != col4 );
    ai_assert( nullptr != vals );

    Value *next( vals );
    col4->r = next->getFloat();
    next = next->m_next;
    if (!next) {
        throw DeadlyImportError( "OpenGEX: Not enough values to fill 4-element color, only 1" );
    }

    col4->g = next->getFloat();
    next = next->m_next;
    if (!next) {
        throw DeadlyImportError( "OpenGEX: Not enough values to fill 4-element color, only 2" );
    }

    col4->b = next->getFloat();
    next = next->m_next;
    if (!next) {
        throw DeadlyImportError( "OpenGEX: Not enough values to fill 4-element color, only 3" );
    }

    col4->a = next->getFloat();
}